

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageview.cpp
# Opt level: O0

void __thiscall QtMWidgets::PageViewPrivate::invalidatePages(PageViewPrivate *this,QRect *r)

{
  QWidget *pQVar1;
  int iVar2;
  int iVar3;
  const_reference ppQVar4;
  QWidget *w_1;
  QWidget *w;
  int index;
  QRect *r_local;
  PageViewPrivate *this_local;
  
  iVar2 = PageControl::currentIndex(this->control);
  if (iVar2 != 0) {
    ppQVar4 = QList<QWidget_*>::at(&this->pages,(long)(iVar2 + -1));
    pQVar1 = *ppQVar4;
    QRect::topLeft(r);
    QWidget::move((QPoint *)pQVar1);
    QWidget::hide();
  }
  iVar3 = PageControl::count(this->control);
  if (iVar2 < iVar3 + -1) {
    ppQVar4 = QList<QWidget_*>::at(&this->pages,(long)(iVar2 + 1));
    pQVar1 = *ppQVar4;
    QRect::topLeft(r);
    QWidget::move((QPoint *)pQVar1);
    QWidget::hide();
  }
  ppQVar4 = QList<QWidget_*>::at(&this->pages,(long)iVar2);
  pQVar1 = *ppQVar4;
  QRect::topLeft(r);
  QWidget::move((QPoint *)pQVar1);
  QWidget::raise();
  this->pagesPrepared = false;
  this->pagesOffset = 0;
  return;
}

Assistant:

void
PageViewPrivate::invalidatePages( const QRect & r )
{
	const int index = control->currentIndex();

	if( index != 0 )
	{
		QWidget * w = pages.at( index - 1 );

		w->move( r.topLeft() );

		w->hide();
	}

	if( index < control->count() - 1 )
	{
		QWidget * w = pages.at( index + 1 );

		w->move( r.topLeft() );

		w->hide();
	}

	pages.at( index )->move( r.topLeft() );

	control->raise();

	pagesPrepared = false;

	pagesOffset = 0;
}